

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

xmlChar * getString(xmlNodePtr cur,char *xpath)

{
  xmlXPathContextPtr_conflict pxVar1;
  long lVar2;
  int *piVar3;
  xmlChar *pxVar4;
  
  pxVar1 = ctxtXPath;
  if (xpath != (char *)0x0 && cur->doc != (xmlDocPtr)0x0) {
    ctxtXPath->doc = cur->doc;
    pxVar1->node = cur;
    lVar2 = xmlXPathCompile(xpath);
    if (lVar2 == 0) {
      fprintf(_stderr,"Failed to compile %s\n",xpath);
      return (xmlChar *)0x0;
    }
    piVar3 = (int *)xmlXPathCompiledEval(lVar2,ctxtXPath);
    xmlXPathFreeCompExpr(lVar2);
    if (piVar3 != (int *)0x0) {
      if (*piVar3 == 4) {
        pxVar4 = *(xmlChar **)(piVar3 + 8);
        piVar3[8] = 0;
        piVar3[9] = 0;
      }
      else {
        pxVar4 = (xmlChar *)0x0;
      }
      xmlXPathFreeObject(piVar3);
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
getString(xmlNodePtr cur, const char *xpath) {
    xmlChar *ret = NULL;
    xmlXPathObjectPtr res;
    xmlXPathCompExprPtr comp;

    if ((cur == NULL)  || (cur->doc == NULL) || (xpath == NULL))
        return(NULL);
    ctxtXPath->doc = cur->doc;
    ctxtXPath->node = cur;
    comp = xmlXPathCompile(BAD_CAST xpath);
    if (comp == NULL) {
        fprintf(stderr, "Failed to compile %s\n", xpath);
	return(NULL);
    }
    res = xmlXPathCompiledEval(comp, ctxtXPath);
    xmlXPathFreeCompExpr(comp);
    if (res == NULL)
        return(NULL);
    if (res->type == XPATH_STRING) {
        ret = res->stringval;
	res->stringval = NULL;
    }
    xmlXPathFreeObject(res);
    return(ret);
}